

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

TValue * trace_exit_gc_cp(lua_State *L,lua_CFunction dummy,void *unused)

{
  lua_State *in_RDI;
  
  *(undefined4 *)((long)in_RDI->cframe + 0x14) = 0;
  *(undefined4 *)((long)in_RDI->cframe + 0x10) = 0xfff00240;
  lj_gc_step(in_RDI);
  return (TValue *)0x0;
}

Assistant:

static TValue *trace_exit_gc_cp(lua_State *L, lua_CFunction dummy, void *unused)
{
  /* Always catch error here and don't call error function. */
  cframe_errfunc(L->cframe) = 0;
  cframe_nres(L->cframe) = -2*LUAI_MAXSTACK*(int)sizeof(TValue);
  lj_gc_step(L);
  UNUSED(dummy);
  UNUSED(unused);
  return NULL;
}